

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O3

int_t mc64sd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *numx,int_t *w,
             int_t *len,int_t *lenl,int_t *lenh,int_t *fc,int_t *iw,int_t *iw4)

{
  int_t *piVar1;
  int_t *piVar2;
  uint *puVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int_t iVar15;
  long lVar16;
  int iVar17;
  double *pdVar18;
  int iVar19;
  int iVar20;
  int_t *piVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  int local_9c;
  uint *local_98;
  int_t nval;
  uint local_8c;
  double local_88;
  double local_80;
  int_t cnt;
  int_t mod;
  int local_6c;
  int local_68;
  uint local_64;
  int *local_60;
  int *local_58;
  int_t *local_50;
  ulong local_48;
  double local_40;
  ulong local_38;
  
  local_50 = iw4 + -1;
  local_60 = ne;
  local_58 = iperm;
  local_88 = dmach("Overflow");
  uVar10 = *n;
  if (0 < (int)uVar10) {
    lVar7 = 1;
    do {
      fc[lVar7 + -1] = (int_t)lVar7;
      iw[lVar7 + -1] = 0;
      len[lVar7 + -1] = ip[lVar7] - ip[lVar7 + -1];
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar10 + 1 != lVar7);
  }
  cnt = 1;
  mod = 1;
  *numx = 0;
  iVar5 = *n;
  local_98 = (uint *)n;
  mc64ud_(&cnt,&mod,n,irn,local_50 + (long)iVar5 + 1,ip,len,fc,iw,numx,n,iw4,
          local_50 + (long)iVar5 + 1,local_50 + (int)(iVar5 * 2 | 1),local_50 + (long)iVar5 * 3 + 1)
  ;
  local_8c = *numx;
  uVar10 = *n;
  dVar22 = local_88;
  if (local_8c == uVar10) {
    if (0 < (int)local_8c) {
      lVar7 = 1;
      dVar24 = local_88;
      iVar15 = *ip;
      do {
        iVar5 = ip[lVar7];
        dVar22 = 0.0;
        if (iVar15 < iVar5) {
          lVar16 = (long)iVar15;
          dVar23 = 0.0;
          do {
            dVar22 = a[lVar16 + -1];
            if (a[lVar16 + -1] <= dVar23) {
              dVar22 = dVar23;
            }
            lVar16 = lVar16 + 1;
            dVar23 = dVar22;
          } while (iVar5 != lVar16);
        }
        if (dVar24 <= dVar22) {
          dVar22 = dVar24;
        }
        lVar7 = lVar7 + 1;
        dVar24 = dVar22;
        iVar15 = iVar5;
      } while (lVar7 != (ulong)local_8c + 1);
    }
    dVar22 = dVar22 * 1.0010000467300415;
  }
  piVar1 = w + -1;
  local_80 = 0.0;
  if ((int)uVar10 < 1) {
    local_9c = 0;
  }
  else {
    local_9c = 0;
    lVar7 = 1;
    do {
      iVar13 = ip[lVar7] - ip[lVar7 + -1];
      lenh[lVar7 + -1] = iVar13;
      len[lVar7 + -1] = iVar13;
      iVar5 = ip[lVar7 + -1];
      iVar6 = ip[lVar7];
      iVar14 = iVar6;
      if (iVar5 < iVar6) {
        pdVar18 = a + (long)iVar5 + -1;
        iVar19 = iVar5;
        do {
          iVar14 = iVar19;
          if (*pdVar18 <= dVar22 && dVar22 != *pdVar18) break;
          iVar19 = iVar19 + 1;
          pdVar18 = pdVar18 + 1;
          iVar14 = iVar6;
        } while (iVar6 != iVar19);
      }
      lenl[lVar7 + -1] = iVar14 - iVar5;
      if (iVar14 - iVar5 != iVar13) {
        lVar16 = (long)local_9c;
        local_9c = local_9c + 1;
        w[lVar16] = (int_t)lVar7;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != (ulong)uVar10 + 1);
  }
  piVar21 = iw + -1;
  local_6c = *local_60;
  if (0 < local_6c) {
    local_40 = 0.0;
    local_48 = 1;
    local_88 = dVar22;
    iVar5 = local_9c;
    do {
      uVar12 = (ulong)local_8c;
      if (local_8c == *numx) {
        uVar10 = *local_98;
        if (0 < (int)uVar10) {
          uVar8 = 0;
          do {
            local_58[uVar8] = iw[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar10 != uVar8);
        }
        local_68 = *local_60;
        uVar10 = local_8c;
        if (0 < local_68) {
          uVar8 = 1;
          do {
            uVar9 = uVar8;
            local_40 = local_80;
            if (((local_88 == local_80) && (!NAN(local_88) && !NAN(local_80))) ||
               (mc64qd_(ip,lenl,len,w,&local_9c,a,&nval,&local_80), nval < 2)) goto LAB_00114b49;
            local_64 = *local_98;
            local_9c = iVar5;
            if ((0 < (int)local_64) && (0 < iVar5)) {
              iVar6 = 1;
              iVar14 = 1;
              do {
                iVar19 = piVar1[iVar14];
                iVar17 = len[(long)iVar19 + -1];
                iVar13 = iVar17 + ip[(long)iVar19 + -1];
                if (lenl[(long)iVar19 + -1] < iVar17) {
                  iVar17 = iVar13 + -1;
                  iVar20 = lenl[(long)iVar19 + -1] + ip[(long)iVar19 + -1];
                  iVar13 = iVar20;
                  if (iVar17 < iVar20) {
                    iVar13 = iVar17;
                  }
                  lVar7 = (long)iVar17 + 1;
                  do {
                    if (local_80 <= a[lVar7 + -2]) {
                      iVar13 = (int)lVar7;
                      break;
                    }
                    if (piVar21[irn[lVar7 + -2]] == iVar19) {
                      piVar21[irn[lVar7 + -2]] = 0;
                      uVar12 = (long)(int)uVar12 - 1;
                      fc[((long)(int)*local_98 - uVar12) + -1] = iVar19;
                    }
                    lVar7 = lVar7 + -1;
                  } while (iVar20 < lVar7);
                  iVar17 = len[(long)iVar19 + -1];
                }
                lenh[(long)iVar19 + -1] = iVar17;
                len[(long)iVar19 + -1] = iVar13 - ip[(long)iVar19 + -1];
                if (lenl[(long)iVar19 + -1] == lenh[(long)iVar19 + -1]) {
                  piVar1[iVar14] = piVar1[iVar5];
                  iVar5 = iVar5 + -1;
                }
                else {
                  iVar14 = iVar14 + 1;
                }
                local_9c = iVar5;
              } while ((iVar6 < (int)local_64) && (iVar6 = iVar6 + 1, iVar14 <= iVar5));
            }
            uVar10 = (uint)uVar12;
            local_38 = uVar9;
            iVar5 = local_9c;
          } while ((*numx <= (int)uVar10) &&
                  (uVar8 = (ulong)((int)uVar9 + 1), (int)uVar9 < local_68));
        }
        mod = 1;
        local_8c = uVar10;
      }
      else {
        local_88 = local_80;
        mc64qd_(ip,len,lenh,w,&local_9c,a,&nval,&local_80);
        if (nval == 0) break;
        if ((local_80 == local_40) && (!NAN(local_80) && !NAN(local_40))) break;
        uVar10 = *local_98;
        local_9c = iVar5;
        if ((0 < (int)uVar10) && (0 < iVar5)) {
          iVar5 = 1;
          iVar6 = 1;
          do {
            lVar7 = (long)piVar1[iVar6];
            iVar13 = ip[lVar7 + -1];
            iVar19 = len[lVar7 + -1];
            iVar14 = iVar19 + iVar13;
            if (iVar19 < lenh[lVar7 + -1]) {
              iVar17 = lenh[lVar7 + -1] + iVar13;
              lVar16 = (long)iVar14;
              iVar14 = iVar19 + iVar13 + 1;
              if (iVar14 <= iVar17) {
                iVar14 = iVar17;
              }
              do {
                if (a[lVar16 + -1] <= local_80 && local_80 != a[lVar16 + -1]) {
                  iVar14 = (int)lVar16;
                  break;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < iVar17);
            }
            lenl[lVar7 + -1] = iVar19;
            len[lVar7 + -1] = iVar14 - ip[lVar7 + -1];
            if (lenl[lVar7 + -1] == lenh[lVar7 + -1]) {
              piVar1[iVar6] = piVar1[local_9c];
              local_9c = local_9c + -1;
            }
            else {
              iVar6 = iVar6 + 1;
            }
          } while ((iVar5 < (int)uVar10) && (iVar5 = iVar5 + 1, iVar6 <= local_9c));
        }
        mod = 0;
        iVar5 = local_9c;
      }
      iVar6 = (int)local_48;
      uVar11 = iVar6 + 1;
      uVar10 = *local_98;
      cnt = uVar11;
      mc64ud_(&cnt,&mod,(int_t *)local_98,irn,iw4 + (int)uVar10,ip,len,fc,iw,(int_t *)&local_8c,numx
              ,iw4,iw4 + (int)uVar10,local_50 + (int)(uVar10 * 2 + 1),iw4 + (long)(int)uVar10 * 3);
      local_48 = (ulong)uVar11;
    } while (iVar6 != local_6c);
  }
LAB_00114b49:
  piVar4 = local_58;
  puVar3 = local_98;
  uVar10 = *local_98;
  if (0 < (int)uVar10 && *numx != uVar10) {
    iVar5 = 0;
    memset(w,0,(ulong)uVar10 << 2);
    uVar10 = *puVar3;
    if (0 < (int)uVar10) {
      lVar7 = 1;
      do {
        iVar6 = piVar4[lVar7 + -1];
        iVar14 = iVar5 + 1;
        piVar2 = piVar1;
        if (iVar6 == 0) {
          iVar5 = iVar14;
          iVar6 = iVar14;
          piVar2 = piVar21;
        }
        piVar2[iVar6] = (int_t)lVar7;
        lVar7 = lVar7 + 1;
      } while ((ulong)uVar10 + 1 != lVar7);
      uVar10 = *puVar3;
      if (0 < (int)uVar10) {
        iVar5 = 0;
        lVar7 = 1;
        do {
          if (w[lVar7 + -1] == 0) {
            lVar16 = (long)iVar5;
            iVar5 = iVar5 + 1;
            piVar4[(long)iw[lVar16] + -1] = (int)lVar7;
          }
          lVar7 = lVar7 + 1;
        } while ((ulong)uVar10 + 1 != lVar7);
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64sd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *numx, int_t *w, 
	int_t *len, int_t *lenl, int_t *lenh, int_t *fc, int_t *iw, 
	int_t *iw4)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, i__4;

    /* Local variables */
    int_t i__, j, k, l, ii, mod, cnt, num;
    double bval, bmin, bmax, rinf;
    int_t nval, wlen, idum1, idum2, idum3;
    extern /* Subroutine */ int_t
	mc64qd_(int_t *, int_t *, int_t *, int_t *, int_t *, double *,
		int_t *, double *), 
	mc64ud_(int_t *, int_t *, int_t *, int_t *, int_t *, 
		int_t *, int_t *, int_t *, int_t *, int_t *, int_t *, 
		int_t *, int_t *, int_t *, int_t *);

/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN, are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   A(K), K=1..NE, must be set to the value of the entry that */
/*   corresponds to IRN(k). The entries in each column must be */
/*   non-negative and ordered by decreasing value. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*   bottleneck matching: IPERM(I) - 0 or row I is matched to column */
/*   IPERM(I). */
/* NUMX is an INT_T variable. On exit, it contains the cardinality */
/*   of the matching stored in IPERM. */
/* IW is an INT_T work array of length 10N. */
/* FC is an int_t array of length N that contains the list of */
/*   unmatched columns. */
/* LEN(J), LENL(J), LENH(J) are int_t arrays of length N that point */
/*   to entries in matrix column J. */
/*   In the matrix defined by the column parts IP(J)+LENL(J) we know */
/*   a matching does not exist; in the matrix defined by the column */
/*   parts IP(J)+LENH(J) we know one exists. */
/*   LEN(J) lies between LENL(J) and LENH(J) and determines the matrix */
/*   that is tested for a maximum matching. */
/* W is an int_t array of length N and contains the indices of the */
/*   columns for which LENL ne LENH. */
/* WLEN is number of indices stored in array W. */
/* IW is int_t work array of length N. */
/* IW4 is int_t work array of length 4N used by MC64U/UD. */
/*      EXTERNAL FD05AD,MC64QD,MC64UD */
/*      DOUBLE PRECISION FD05AD */
/* BMIN and BMAX are such that a maximum matching exists for the input */
/*   matrix in which all entries smaller than BMIN are dropped. */
/*   For BMAX, a maximum matching does not exist. */
/* BVAL is a value between BMIN and BMAX. */
/* CNT is the number of calls made to MC64U/UD so far. */
/* NUM is the cardinality of last matching found. */
/* Set RINF to largest positive real number */
/* XSL      RINF = FD05AD(5) */
    /* Parameter adjustments */
    --iw4;
    --iw;
    --fc;
    --lenh;
    --lenl;
    --len;
    --w;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Compute a first maximum matching from scratch on whole matrix. */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	fc[j] = j;
	iw[j] = 0;
	len[j] = ip[j + 1] - ip[j];
/* L20: */
    }
/* The first call to MC64U/UD */
    cnt = 1;
    mod = 1;
    *numx = 0;
    mc64ud_(&cnt, &mod, n, &irn[1], ne, &ip[1], &len[1], &fc[1], &iw[1], numx,
	     n, &iw4[1], &iw4[*n + 1], &iw4[(*n << 1) + 1], &iw4[*n * 3 + 1]);
/* IW contains a maximum matching of length NUMX. */
    num = *numx;
    if (num != *n) {
/* Matrix is structurally singular */
	bmax = rinf;
    } else {
/* Matrix is structurally nonsingular, NUM=NUMX=N; */
/* Set BMAX just above the smallest of all the maximum absolute */
/* values of the columns */
	bmax = rinf;
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    bval = 0.f;
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		if (a[k] > bval) {
		    bval = a[k];
		}
/* L25: */
	    }
	    if (bval < bmax) {
		bmax = bval;
	    }
/* L30: */
	}
	bmax *= 1.001f;
    }
/* Initialize BVAL,BMIN */
    bval = 0.f;
    bmin = 0.f;
/* Initialize LENL,LEN,LENH,W,WLEN according to BMAX. */
/* Set LEN(J), LENH(J) just after last entry in column J. */
/* Set LENL(J) just after last entry in column J with value ge BMAX. */
    wlen = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ip[j + 1] - ip[j];
	lenh[j] = l;
	len[j] = l;
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    if (a[k] < bmax) {
		goto L46;
	    }
/* L45: */
	}
/* Column J is empty or all entries are ge BMAX */
	k = ip[j + 1];
L46:
	lenl[j] = k - ip[j];
/* Add J to W if LENL(J) ne LENH(J) */
	if (lenl[j] == l) {
	    goto L48;
	}
	++wlen;
	w[wlen] = j;
L48:
	;
    }
/* Main loop */
    i__1 = *ne;
    for (idum1 = 1; idum1 <= i__1; ++idum1) {
	if (num == *numx) {
/* We have a maximum matching in IW; store IW in IPERM */
	    i__2 = *n;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		iperm[i__] = iw[i__];
/* L50: */
	    }
/* Keep going round this loop until matching IW is no longer maximum. */
	    i__2 = *ne;
	    for (idum2 = 1; idum2 <= i__2; ++idum2) {
		bmin = bval;
		if (bmax == bmin) {
		    goto L99;
		}
/* Find splitting value BVAL */
		mc64qd_(&ip[1], &lenl[1], &len[1], &w[1], &wlen, &a[1], &nval,
			 &bval);
		if (nval <= 1) {
		    goto L99;
		}
/* Set LEN such that all matrix entries with value lt BVAL are */
/* discarded. Store old LEN in LENH. Do this for all columns W(K). */
/* Each step, either K is incremented or WLEN is decremented. */
		k = 1;
		i__3 = *n;
		for (idum3 = 1; idum3 <= i__3; ++idum3) {
		    if (k > wlen) {
			goto L71;
		    }
		    j = w[k];
		    i__4 = ip[j] + lenl[j];
		    for (ii = ip[j] + len[j] - 1; ii >= i__4; --ii) {
			if (a[ii] >= bval) {
			    goto L60;
			}
			i__ = irn[ii];
			if (iw[i__] != j) {
			    goto L55;
			}
/* Remove entry from matching */
			iw[i__] = 0;
			--num;
			fc[*n - num] = j;
L55:
			;
		    }
L60:
		    lenh[j] = len[j];
/* IP(J)+LEN(J)-1 is last entry in column ge BVAL */
		    len[j] = ii - ip[j] + 1;
/* If LENH(J) = LENL(J), remove J from W */
		    if (lenl[j] == lenh[j]) {
			w[k] = w[wlen];
			--wlen;
		    } else {
			++k;
		    }
/* L70: */
		}
L71:
		if (num < *numx) {
		    goto L81;
		}
/* L80: */
	    }
/* End of dummy loop; this point is never reached */
/* Set mode for next call to MC64U/UD */
L81:
	    mod = 1;
	} else {
/* We do not have a maximum matching in IW. */
	    bmax = bval;
/* BMIN is the bottleneck value of a maximum matching; */
/* for BMAX the matching is not maximum, so BMAX>BMIN */
/*          IF (BMAX .EQ. BMIN) GO TO 99 */
/* Find splitting value BVAL */
	    mc64qd_(&ip[1], &len[1], &lenh[1], &w[1], &wlen, &a[1], &nval, &
		    bval);
	    if (nval == 0 || bval == bmin) {
		goto L99;
	    }
/* Set LEN such that all matrix entries with value ge BVAL are */
/* inside matrix. Store old LEN in LENL. Do this for all columns W(K). */
/* Each step, either K is incremented or WLEN is decremented. */
	    k = 1;
	    i__2 = *n;
	    for (idum3 = 1; idum3 <= i__2; ++idum3) {
		if (k > wlen) {
		    goto L88;
		}
		j = w[k];
		i__3 = ip[j] + lenh[j] - 1;
		for (ii = ip[j] + len[j]; ii <= i__3; ++ii) {
		    if (a[ii] < bval) {
			goto L86;
		    }
/* L85: */
		}
L86:
		lenl[j] = len[j];
		len[j] = ii - ip[j];
		if (lenl[j] == lenh[j]) {
		    w[k] = w[wlen];
		    --wlen;
		} else {
		    ++k;
		}
/* L87: */
	    }
/* End of dummy loop; this point is never reached */
/* Set mode for next call to MC64U/UD */
L88:
	    mod = 0;
	}
	++cnt;
	mc64ud_(&cnt, &mod, n, &irn[1], ne, &ip[1], &len[1], &fc[1], &iw[1], &
		num, numx, &iw4[1], &iw4[*n + 1], &iw4[(*n << 1) + 1], &iw4[*
		n * 3 + 1]);
/* IW contains maximum matching of length NUM */
/* L90: */
    }
/* End of dummy loop; this point is never reached */
/* BMIN is bottleneck value of final matching */
L99:
    if (*numx == *n) {
	goto L1000;
    }
/* The matrix is structurally singular, complete IPERM */
/* W, IW are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	w[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    iw[k] = i__;
	} else {
	    j = iperm[i__];
	    w[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (w[j] != 0) {
	    goto L320;
	}
	++k;
	idum1 = iw[k];
	iperm[idum1] = j;
L320:
	;
    }
L1000:
    return 0;
}